

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void fprint_timestamp(FILE *fd,char *file,int line,char *func,int priority,char *message,
                     char *appendix)

{
  size_t sVar1;
  char local_118 [8];
  char buf [200];
  time_t local_48;
  time_t t;
  tm *ptm;
  char *message_local;
  char *pcStack_28;
  int priority_local;
  char *func_local;
  char *pcStack_18;
  int line_local;
  char *file_local;
  FILE *fd_local;
  
  ptm = (tm *)message;
  message_local._4_4_ = priority;
  pcStack_28 = func;
  func_local._4_4_ = line;
  pcStack_18 = file;
  file_local = (char *)fd;
  local_48 = time((time_t *)0x0);
  t = (time_t)localtime(&local_48);
  if (((tm *)t == (tm *)0x0) || (sVar1 = strftime(local_118,200,"%F %T",(tm *)t), sVar1 == 0)) {
    if (appendix == (char *)0x0) {
      fprintf((FILE *)file_local,"%s:%u %s(...) %s\n",pcStack_18,(ulong)func_local._4_4_,pcStack_28,
              ptm);
    }
    else {
      fprintf((FILE *)file_local,"%s:%u %s(...) %s: %s\n",pcStack_18,(ulong)func_local._4_4_,
              pcStack_28,ptm,appendix);
    }
  }
  else if (appendix == (char *)0x0) {
    fprintf((FILE *)file_local,"%s %s:%u %s(...) %s\n",local_118,pcStack_18,(ulong)func_local._4_4_,
            pcStack_28,ptm);
  }
  else {
    fprintf((FILE *)file_local,"%s %s:%u %s(...) %s: %s\n",local_118,pcStack_18,
            (ulong)func_local._4_4_,pcStack_28,ptm,appendix);
  }
  return;
}

Assistant:

static void fprint_timestamp(
		FILE* fd,
		const char *file, int line, const char *func, int priority, const char *message, const char *appendix)
{
    struct tm * ptm;
    time_t t;
    char buf[200];

    t = time(NULL);
    ptm = localtime(&t);
    if (ptm == NULL || strftime(buf, sizeof(buf), "%F %T", ptm) == 0) {
        if (appendix)
            fprintf(fd, "%s:%u %s(...) %s: %s\n", file, line, func, message, appendix);
        else
            fprintf(fd, "%s:%u %s(...) %s\n", file, line, func, message);
    }
    else {
        if (appendix)
            fprintf(fd, "%s %s:%u %s(...) %s: %s\n", buf, file, line, func, message, appendix);
        else
            fprintf(fd, "%s %s:%u %s(...) %s\n", buf, file, line, func, message);
    }
}